

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 * __thiscall google::protobuf::uint128::operator+=(uint128 *this,uint128 *b)

{
  ulong uVar1;
  uint64 lolo;
  uint128 *b_local;
  uint128 *this_local;
  
  this->hi_ = b->hi_ + this->hi_;
  uVar1 = this->lo_ + b->lo_;
  if (uVar1 < this->lo_) {
    this->hi_ = this->hi_ + 1;
  }
  this->lo_ = uVar1;
  return this;
}

Assistant:

inline uint128& uint128::operator+=(const uint128& b) {
  hi_ += b.hi_;
  uint64 lolo = lo_ + b.lo_;
  if (lolo < lo_)
    ++hi_;
  lo_ = lolo;
  return *this;
}